

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void cio_timer_close(cio_timer *timer)

{
  cio_linux_eventloop_remove((timer->impl).loop,&(timer->impl).ev);
  if (timer->handler != (cio_timer_handler_t)0x0) {
    cio_timer_cancel(timer);
  }
  close((timer->impl).ev.fd);
  if (timer->close_hook != (cio_timer_close_hook_t)0x0) {
    (*timer->close_hook)(timer);
    return;
  }
  return;
}

Assistant:

void cio_timer_close(struct cio_timer *timer)
{
	cio_linux_eventloop_remove(timer->impl.loop, &timer->impl.ev);
	if (timer->handler != NULL) {
		cio_timer_cancel(timer);
	}

	close(timer->impl.ev.fd);
	if (timer->close_hook != NULL) {
		timer->close_hook(timer);
	}
}